

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Underwater_Acoustic_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Underwater_Acoustic_PDU::Underwater_Acoustic_PDU(Underwater_Acoustic_PDU *this)

{
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Underwater_Acoustic_PDU_00334400;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EmittingEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EventID);
  this->m_ui8Padding1 = '\0';
  *(undefined8 *)&this->m_ui8NumShafts = 0;
  *(undefined8 *)
   ((long)&(this->m_vShafts).
           super__Vector_base<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>.
           _M_impl.super__Vector_impl_data._M_start + 5) = 0;
  *(undefined8 *)
   ((long)&(this->m_vShafts).
           super__Vector_base<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>.
           _M_impl.super__Vector_impl_data._M_finish + 5) = 0;
  *(undefined8 *)
   ((long)&(this->m_vShafts).
           super__Vector_base<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 5) = 0;
  *(undefined8 *)
   ((long)&(this->m_vAPA).
           super__Vector_base<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>._M_impl.
           super__Vector_impl_data._M_start + 5) = 0;
  *(undefined8 *)
   ((long)&(this->m_vAPA).
           super__Vector_base<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>._M_impl.
           super__Vector_impl_data._M_finish + 5) = 0;
  *(undefined8 *)
   ((long)&(this->m_vAPA).
           super__Vector_base<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 5) = 0;
  *(undefined8 *)
   ((long)&(this->m_vUAES).
           super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
           ._M_impl.super__Vector_impl_data._M_start + 5) = 0;
  (this->m_vUAES).
  super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vUAES).
  super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Header).super_Header6.m_ui8PDUType = '\x1d';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x06';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x20;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

Underwater_Acoustic_PDU::Underwater_Acoustic_PDU() :
    m_ui8Padding1( 0 ),
    m_ui8NumAPA( 0 ),
    m_ui8NumEmitterSys( 0 ),
    m_ui8NumShafts( 0 )
{
    m_ui8ProtocolFamily = Distributed_Emission_Regeneration;
    m_ui8PDUType = UnderwaterAcoustic_PDU_Type;
    m_ui16PDULength = UNDERWATER_ACOUSTIC_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}